

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  size_t k;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  char cVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong *puVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong unaff_R12;
  undefined1 (*pauVar31) [32];
  bool bVar32;
  float fVar33;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 in_ZMM1 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar64 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  float fVar68;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  vfloat4 a0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined1 local_2920 [8];
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar82 [32];
  undefined1 auVar86 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar52 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar46 = *(undefined1 (*) [32])(ray + 0x100);
    auVar59 = vpcmpeqd_avx2(auVar52,(undefined1  [32])valid_i->field_0);
    auVar52 = vcmpps_avx(auVar46,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar52 = vandps_avx(auVar52,auVar59);
    uVar23 = vmovmskps_avx(auVar52);
    if (uVar23 != 0) {
      auVar4 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar66._0_4_ = local_2940._0_4_ * local_2940._0_4_;
      auVar66._4_4_ = local_2940._4_4_ * local_2940._4_4_;
      auVar66._8_4_ = local_2940._8_4_ * local_2940._8_4_;
      auVar66._12_4_ = local_2940._12_4_ * local_2940._12_4_;
      auVar66._16_4_ = local_2940._16_4_ * local_2940._16_4_;
      auVar66._20_4_ = local_2940._20_4_ * local_2940._20_4_;
      auVar66._28_36_ = in_ZMM5._28_36_;
      auVar66._24_4_ = local_2940._24_4_ * local_2940._24_4_;
      auVar69 = vfmadd231ps_fma(auVar66._0_32_,local_2960,local_2960);
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_2980,local_2980);
      auVar52 = vrsqrtps_avx(ZEXT1632(auVar69));
      uVar24 = (ulong)(uVar23 & 0xff);
      fVar68 = auVar52._0_4_;
      fVar73 = auVar52._4_4_;
      fVar74 = auVar52._8_4_;
      fVar75 = auVar52._12_4_;
      fVar76 = auVar52._16_4_;
      fVar77 = auVar52._20_4_;
      fVar78 = auVar52._24_4_;
      auVar59._4_4_ = fVar73 * fVar73 * fVar73 * auVar69._4_4_ * -0.5;
      auVar59._0_4_ = fVar68 * fVar68 * fVar68 * auVar69._0_4_ * -0.5;
      auVar59._8_4_ = fVar74 * fVar74 * fVar74 * auVar69._8_4_ * -0.5;
      auVar59._12_4_ = fVar75 * fVar75 * fVar75 * auVar69._12_4_ * -0.5;
      auVar59._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar59._20_4_ = fVar77 * fVar77 * fVar77 * -0.0;
      auVar59._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
      auVar59._28_4_ = 0;
      auVar63._8_4_ = 0x3fc00000;
      auVar63._0_8_ = 0x3fc000003fc00000;
      auVar63._12_4_ = 0x3fc00000;
      auVar63._16_4_ = 0x3fc00000;
      auVar63._20_4_ = 0x3fc00000;
      auVar63._24_4_ = 0x3fc00000;
      auVar63._28_4_ = 0x3fc00000;
      auVar69 = vfmadd213ps_fma(auVar63,auVar52,auVar59);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar69);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar69._12_4_ = 0;
      auVar69._0_12_ = ZEXT812(0);
      auVar69 = auVar69 << 0x20;
      do {
        lVar27 = 0;
        for (uVar29 = uVar24; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar29 = (ulong)(uint)((int)lVar27 * 4);
        auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar29 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar29 + 0xa0)),0x1c);
        auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + uVar29 + 0xc0)),0x28);
        fVar68 = *(float *)((long)&local_27c0 + uVar29);
        auVar89._0_4_ = auVar85._0_4_ * fVar68;
        auVar89._4_4_ = auVar85._4_4_ * fVar68;
        auVar89._8_4_ = auVar85._8_4_ * fVar68;
        auVar89._12_4_ = auVar85._12_4_ * fVar68;
        auVar95 = vshufpd_avx(auVar89,auVar89,1);
        auVar85 = vmovshdup_avx(auVar89);
        auVar93 = vunpckhps_avx(auVar89,auVar69);
        auVar92._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
        auVar92._8_8_ = auVar95._8_8_ ^ auVar64._8_8_;
        auVar92 = vinsertps_avx(auVar92,auVar89,0x2a);
        auVar93 = vshufps_avx(auVar93,ZEXT416(auVar85._0_4_ ^ 0x80000000),0x41);
        auVar85 = vdpps_avx(auVar92,auVar92,0x7f);
        auVar95 = vdpps_avx(auVar93,auVar93,0x7f);
        auVar85 = vcmpps_avx(auVar85,auVar95,1);
        auVar97._0_4_ = auVar85._0_4_;
        auVar97._4_4_ = auVar97._0_4_;
        auVar97._8_4_ = auVar97._0_4_;
        auVar97._12_4_ = auVar97._0_4_;
        auVar85 = vblendvps_avx(auVar92,auVar93,auVar97);
        auVar95 = vdpps_avx(auVar85,auVar85,0x7f);
        auVar92 = vrsqrtss_avx(auVar95,auVar95);
        fVar73 = auVar92._0_4_;
        fVar73 = fVar73 * 1.5 - auVar95._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        auVar93._0_4_ = auVar85._0_4_ * fVar73;
        auVar93._4_4_ = auVar85._4_4_ * fVar73;
        auVar93._8_4_ = auVar85._8_4_ * fVar73;
        auVar93._12_4_ = auVar85._12_4_ * fVar73;
        auVar85 = vshufps_avx(auVar93,auVar93,0xc9);
        auVar95 = vshufps_avx(auVar89,auVar89,0xc9);
        auVar98._0_4_ = auVar93._0_4_ * auVar95._0_4_;
        auVar98._4_4_ = auVar93._4_4_ * auVar95._4_4_;
        auVar98._8_4_ = auVar93._8_4_ * auVar95._8_4_;
        auVar98._12_4_ = auVar93._12_4_ * auVar95._12_4_;
        auVar85 = vfmsub231ps_fma(auVar98,auVar89,auVar85);
        auVar92 = vshufps_avx(auVar85,auVar85,0xc9);
        auVar85 = vdpps_avx(auVar92,auVar92,0x7f);
        lVar27 = lVar27 * 0x30;
        auVar95 = vrsqrtss_avx(auVar85,auVar85);
        fVar73 = auVar95._0_4_;
        fVar73 = fVar73 * 1.5 - auVar85._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        uVar24 = uVar24 - 1 & uVar24;
        auVar95._0_4_ = fVar73 * auVar92._0_4_;
        auVar95._4_4_ = fVar73 * auVar92._4_4_;
        auVar95._8_4_ = fVar73 * auVar92._8_4_;
        auVar95._12_4_ = fVar73 * auVar92._12_4_;
        auVar85._0_4_ = fVar68 * auVar89._0_4_;
        auVar85._4_4_ = fVar68 * auVar89._4_4_;
        auVar85._8_4_ = fVar68 * auVar89._8_4_;
        auVar85._12_4_ = fVar68 * auVar89._12_4_;
        auVar92 = vunpcklps_avx(auVar93,auVar85);
        auVar85 = vunpckhps_avx(auVar93,auVar85);
        auVar93 = vunpcklps_avx(auVar95,auVar69);
        auVar95 = vunpckhps_avx(auVar95,auVar69);
        auVar95 = vunpcklps_avx(auVar85,auVar95);
        auVar89 = vunpcklps_avx(auVar92,auVar93);
        auVar85 = vunpckhps_avx(auVar92,auVar93);
        *(undefined1 (*) [16])(local_27a0 + lVar27) = auVar89;
        *(undefined1 (*) [16])(auStack_2790 + lVar27) = auVar85;
        *(undefined1 (*) [16])(auStack_2780 + lVar27) = auVar95;
      } while (uVar24 != 0);
      local_29e0._0_8_ = *(undefined8 *)ray;
      local_29e0._8_8_ = *(undefined8 *)(ray + 8);
      local_29e0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_29e0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_29e0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_29e0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_29e0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_29e0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_29e0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_29e0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_29e0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_29e0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_27e0._8_4_ = 0x7fffffff;
      local_27e0._0_8_ = 0x7fffffff7fffffff;
      local_27e0._12_4_ = 0x7fffffff;
      local_27e0._16_4_ = 0x7fffffff;
      local_27e0._20_4_ = 0x7fffffff;
      local_27e0._24_4_ = 0x7fffffff;
      local_27e0._28_4_ = 0x7fffffff;
      auVar86._8_4_ = 0x219392ef;
      auVar86._0_8_ = 0x219392ef219392ef;
      auVar86._12_4_ = 0x219392ef;
      auVar86._16_4_ = 0x219392ef;
      auVar86._20_4_ = 0x219392ef;
      auVar86._24_4_ = 0x219392ef;
      auVar86._28_4_ = 0x219392ef;
      auVar88 = ZEXT3264(auVar86);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = &DAT_3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar79._16_4_ = 0x3f800000;
      auVar79._20_4_ = 0x3f800000;
      auVar79._24_4_ = 0x3f800000;
      auVar79._28_4_ = 0x3f800000;
      auVar52 = vandps_avx(local_27e0,local_2980);
      auVar57 = vdivps_avx(auVar79,local_2980);
      auVar59 = vcmpps_avx(auVar52,auVar86,1);
      auVar60 = vdivps_avx(auVar79,local_2960);
      auVar52 = vandps_avx(local_27e0,local_2960);
      auVar61 = vdivps_avx(auVar79,_local_2940);
      auVar63 = vcmpps_avx(auVar52,auVar86,1);
      auVar52 = vandps_avx(local_27e0,_local_2940);
      auVar82._8_4_ = 0x5d5e0b6b;
      auVar82._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar82._12_4_ = 0x5d5e0b6b;
      auVar82._16_4_ = 0x5d5e0b6b;
      auVar82._20_4_ = 0x5d5e0b6b;
      auVar82._24_4_ = 0x5d5e0b6b;
      auVar82._28_4_ = 0x5d5e0b6b;
      auVar84 = ZEXT3264(auVar82);
      _local_2920 = vblendvps_avx(auVar57,auVar82,auVar59);
      local_2900 = vblendvps_avx(auVar60,auVar82,auVar63);
      auVar52 = vcmpps_avx(auVar52,auVar86,1);
      local_28e0 = vblendvps_avx(auVar61,auVar82,auVar52);
      auVar66 = ZEXT864(0) << 0x20;
      auVar52 = vcmpps_avx(_local_2920,ZEXT832(0) << 0x20,1);
      auVar70._8_4_ = 0x10;
      auVar70._0_8_ = 0x1000000010;
      auVar70._12_4_ = 0x10;
      auVar70._16_4_ = 0x10;
      auVar70._20_4_ = 0x10;
      auVar70._24_4_ = 0x10;
      auVar70._28_4_ = 0x10;
      local_28c0 = vandps_avx(auVar52,auVar70);
      auVar60._8_4_ = 0x20;
      auVar60._0_8_ = 0x2000000020;
      auVar60._12_4_ = 0x20;
      auVar60._16_4_ = 0x20;
      auVar60._20_4_ = 0x20;
      auVar60._24_4_ = 0x20;
      auVar60._28_4_ = 0x20;
      auVar71._8_4_ = 0x30;
      auVar71._0_8_ = 0x3000000030;
      auVar71._12_4_ = 0x30;
      auVar71._16_4_ = 0x30;
      auVar71._20_4_ = 0x30;
      auVar71._24_4_ = 0x30;
      auVar71._28_4_ = 0x30;
      auVar52 = vcmpps_avx(local_2900,ZEXT832(0) << 0x20,5);
      local_28a0 = vblendvps_avx(auVar71,auVar60,auVar52);
      auVar57._8_4_ = 0x40;
      auVar57._0_8_ = 0x4000000040;
      auVar57._12_4_ = 0x40;
      auVar57._16_4_ = 0x40;
      auVar57._20_4_ = 0x40;
      auVar57._24_4_ = 0x40;
      auVar57._28_4_ = 0x40;
      auVar61._8_4_ = 0x50;
      auVar61._0_8_ = 0x5000000050;
      auVar61._12_4_ = 0x50;
      auVar61._16_4_ = 0x50;
      auVar61._20_4_ = 0x50;
      auVar61._24_4_ = 0x50;
      auVar61._28_4_ = 0x50;
      auVar59 = ZEXT832(0) << 0x20;
      auVar52 = vcmpps_avx(local_28e0,auVar59,5);
      local_2880 = vblendvps_avx(auVar61,auVar57,auVar52);
      auVar52 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar59);
      auVar46 = vmaxps_avx(auVar46,auVar59);
      local_2800 = vpmovsxwd_avx2(auVar4);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar96 = ZEXT3264(local_1e80);
      local_2860 = vblendvps_avx(local_1e80,auVar52,local_2800);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar52._16_4_ = 0xff800000;
      auVar52._20_4_ = 0xff800000;
      auVar52._24_4_ = 0xff800000;
      auVar52._28_4_ = 0xff800000;
      local_2840 = vblendvps_avx(auVar52,auVar46,local_2800);
      auVar69 = vpcmpeqd_avx(local_2840._0_16_,local_2840._0_16_);
      local_2a40 = vpmovsxwd_avx2(auVar4 ^ auVar69);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar23 = 5;
      }
      else {
        uVar23 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar28 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar31 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_2820._16_16_ = mm_lookupmask_ps._0_16_;
      local_2820._0_16_ = mm_lookupmask_ps._0_16_;
      local_1e60 = local_2860;
      auVar91 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                   CONCAT424(0x3f7ffffa,
                                             CONCAT420(0x3f7ffffa,
                                                       CONCAT416(0x3f7ffffa,
                                                                 CONCAT412(0x3f7ffffa,
                                                                           CONCAT48(0x3f7ffffa,
                                                                                                                                                                        
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar100 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      do {
        pauVar31 = pauVar31 + -1;
        root.ptr = puVar28[-1];
        puVar28 = puVar28 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_005bf45e:
          iVar22 = 3;
        }
        else {
          auVar46 = *pauVar31;
          auVar52 = vcmpps_avx(auVar46,local_2840,1);
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar52 >> 0x7f,0) == '\0') &&
                (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar52 >> 0xbf,0) == '\0') &&
              (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar52[0x1f]) {
            iVar22 = 2;
          }
          else {
            uVar30 = vmovmskps_avx(auVar52);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar30);
            iVar22 = 0;
            if ((uint)POPCOUNT(uVar30) <= uVar23) {
              for (; unaff_R12 != 0; unaff_R12 = unaff_R12 - 1 & unaff_R12) {
                k = 0;
                for (uVar24 = unaff_R12; (uVar24 & 1) == 0;
                    uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                  k = k + 1;
                }
                local_2a20._0_8_ = k;
                auVar66 = ZEXT1664(auVar66._0_16_);
                auVar84 = ZEXT1664(auVar84._0_16_);
                auVar88 = ZEXT1664(auVar88._0_16_);
                bVar32 = occluded1(This,bvh,root,k,(Precalculations *)&local_27c0,ray,
                                   (TravRayK<8,_true> *)&local_29e0.field_0,context);
                if (bVar32) {
                  *(undefined4 *)(local_2a40 + local_2a20._0_8_ * 4) = 0xffffffff;
                }
                auVar96 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar91 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                             CONCAT424(0x3f7ffffa,
                                                       CONCAT420(0x3f7ffffa,
                                                                 CONCAT416(0x3f7ffffa,
                                                                           CONCAT412(0x3f7ffffa,
                                                                                     CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              }
              auVar52 = _DAT_0205a980 & ~local_2a40;
              iVar22 = 3;
              auVar100 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              unaff_R12 = 0;
              if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar52 >> 0x7f,0) != '\0') ||
                    (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0xbf,0) != '\0') ||
                  (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar52[0x1f] < '\0') {
                auVar56._8_4_ = 0xff800000;
                auVar56._0_8_ = 0xff800000ff800000;
                auVar56._12_4_ = 0xff800000;
                auVar56._16_4_ = 0xff800000;
                auVar56._20_4_ = 0xff800000;
                auVar56._24_4_ = 0xff800000;
                auVar56._28_4_ = 0xff800000;
                local_2840 = vblendvps_avx(local_2840,auVar56,local_2a40);
                iVar22 = 2;
              }
            }
            if (uVar23 < (uint)POPCOUNT(uVar30)) {
              unaff_R12 = 8;
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar46 = vcmpps_avx(local_2840,auVar46,6);
                    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar46 >> 0x7f,0) == '\0') &&
                          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar46 >> 0xbf,0) == '\0') &&
                        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar46[0x1f]) {
                      iVar22 = 2;
                    }
                    else {
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      local_2a00 = local_2820._0_8_;
                      uStack_29f8 = local_2820._8_8_;
                      uStack_29f0 = local_2820._16_8_;
                      uStack_29e8 = local_2820._24_8_;
                      local_2a20 = local_2a40;
                      uVar26 = vmovmskps_avx(local_2a40);
                      if ((uVar26 ^ 0xff) != 0) {
                        uVar24 = (ulong)(byte)(uVar26 ^ 0xff);
                        do {
                          lVar27 = 0;
                          for (uVar29 = uVar24; (uVar29 & 1) == 0;
                              uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                            lVar27 = lVar27 + 1;
                          }
                          auVar66 = ZEXT1664(auVar66._0_16_);
                          auVar84 = ZEXT1664(auVar84._0_16_);
                          auVar88 = ZEXT1664(auVar88._0_16_);
                          cVar21 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                             (&local_27c0,ray,lVar27,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar21 != '\0') {
                            *(undefined4 *)((long)&local_2a00 + lVar27 * 4) = 0xffffffff;
                          }
                          uVar24 = uVar24 - 1 & uVar24;
                        } while (uVar24 != 0);
                      }
                      auVar14._8_8_ = uStack_29f8;
                      auVar14._0_8_ = local_2a00;
                      auVar14._16_8_ = uStack_29f0;
                      auVar14._24_8_ = uStack_29e8;
                      local_2a40 = vorps_avx(local_2a20,auVar14);
                      auVar46 = _DAT_0205a980 & ~local_2a40;
                      if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar46 >> 0x7f,0) == '\0') &&
                            (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar46 >> 0xbf,0) == '\0') &&
                          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar46[0x1f]) {
                        iVar22 = 3;
                      }
                      else {
                        auVar55._8_4_ = 0xff800000;
                        auVar55._0_8_ = 0xff800000ff800000;
                        auVar55._12_4_ = 0xff800000;
                        auVar55._16_4_ = 0xff800000;
                        auVar55._20_4_ = 0xff800000;
                        auVar55._24_4_ = 0xff800000;
                        auVar55._28_4_ = 0xff800000;
                        local_2840 = vblendvps_avx(local_2840,auVar55,local_2a40);
                        iVar22 = 0;
                      }
                    }
                    unaff_R12 = 0;
                    auVar96 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar91 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                 CONCAT424(0x3f7ffffa,
                                                           CONCAT420(0x3f7ffffa,
                                                                     CONCAT416(0x3f7ffffa,
                                                                               CONCAT412(0x3f7ffffa,
                                                                                         CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar100 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                    break;
                  }
                  goto LAB_005bf45e;
                }
                uVar25 = root.ptr & 0xfffffffffffffff0;
                auVar99 = ZEXT3264(auVar96._0_32_);
                uVar24 = 0;
                uVar29 = unaff_R12;
                do {
                  uVar2 = *(ulong *)(uVar25 + uVar24 * 8);
                  if (uVar2 != 8) {
                    auVar67._28_36_ = auVar66._28_36_;
                    fVar68 = auVar100._0_4_;
                    fVar73 = auVar100._4_4_;
                    fVar74 = auVar100._8_4_;
                    fVar75 = auVar100._12_4_;
                    fVar76 = auVar100._16_4_;
                    fVar77 = auVar100._20_4_;
                    fVar78 = auVar100._24_4_;
                    if ((root.ptr & 7) == 0) {
                      uVar30 = *(undefined4 *)(root.ptr + 0x20 + uVar24 * 4);
                      auVar34._4_4_ = uVar30;
                      auVar34._0_4_ = uVar30;
                      auVar34._8_4_ = uVar30;
                      auVar34._12_4_ = uVar30;
                      auVar34._16_4_ = uVar30;
                      auVar34._20_4_ = uVar30;
                      auVar34._24_4_ = uVar30;
                      auVar34._28_4_ = uVar30;
                      auVar15._8_8_ = local_29e0._8_8_;
                      auVar15._0_8_ = local_29e0._0_8_;
                      auVar15._16_8_ = local_29e0._16_8_;
                      auVar15._24_8_ = local_29e0._24_8_;
                      auVar17._8_8_ = local_29e0._40_8_;
                      auVar17._0_8_ = local_29e0._32_8_;
                      auVar17._16_8_ = local_29e0._48_8_;
                      auVar17._24_8_ = local_29e0._56_8_;
                      auVar19._8_8_ = local_29e0._72_8_;
                      auVar19._0_8_ = local_29e0._64_8_;
                      auVar19._16_8_ = local_29e0._80_8_;
                      auVar19._24_8_ = local_29e0._88_8_;
                      auVar46 = vsubps_avx(auVar34,auVar15);
                      auVar67._0_4_ = (float)local_2920._0_4_ * auVar46._0_4_;
                      auVar67._4_4_ = (float)local_2920._4_4_ * auVar46._4_4_;
                      auVar67._8_4_ = fStack_2918 * auVar46._8_4_;
                      auVar67._12_4_ = fStack_2914 * auVar46._12_4_;
                      auVar67._16_4_ = fStack_2910 * auVar46._16_4_;
                      auVar67._20_4_ = fStack_290c * auVar46._20_4_;
                      auVar67._24_4_ = fStack_2908 * auVar46._24_4_;
                      auVar57 = auVar67._0_32_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x40 + uVar24 * 4);
                      auVar35._4_4_ = uVar30;
                      auVar35._0_4_ = uVar30;
                      auVar35._8_4_ = uVar30;
                      auVar35._12_4_ = uVar30;
                      auVar35._16_4_ = uVar30;
                      auVar35._20_4_ = uVar30;
                      auVar35._24_4_ = uVar30;
                      auVar35._28_4_ = uVar30;
                      auVar46 = vsubps_avx(auVar35,auVar17);
                      uVar30 = *(undefined4 *)(root.ptr + 0x60 + uVar24 * 4);
                      auVar80._4_4_ = uVar30;
                      auVar80._0_4_ = uVar30;
                      auVar80._8_4_ = uVar30;
                      auVar80._12_4_ = uVar30;
                      auVar80._16_4_ = uVar30;
                      auVar80._20_4_ = uVar30;
                      auVar80._24_4_ = uVar30;
                      auVar80._28_4_ = uVar30;
                      auVar84._0_4_ = local_2900._0_4_ * auVar46._0_4_;
                      auVar84._4_4_ = local_2900._4_4_ * auVar46._4_4_;
                      auVar84._8_4_ = local_2900._8_4_ * auVar46._8_4_;
                      auVar84._12_4_ = local_2900._12_4_ * auVar46._12_4_;
                      auVar84._16_4_ = local_2900._16_4_ * auVar46._16_4_;
                      auVar84._20_4_ = local_2900._20_4_ * auVar46._20_4_;
                      auVar84._24_4_ = local_2900._24_4_ * auVar46._24_4_;
                      auVar83 = auVar84._0_32_;
                      auVar46 = vsubps_avx(auVar80,auVar19);
                      auVar88._0_4_ = local_28e0._0_4_ * auVar46._0_4_;
                      auVar88._4_4_ = local_28e0._4_4_ * auVar46._4_4_;
                      auVar88._8_4_ = local_28e0._8_4_ * auVar46._8_4_;
                      auVar88._12_4_ = local_28e0._12_4_ * auVar46._12_4_;
                      auVar88._16_4_ = local_28e0._16_4_ * auVar46._16_4_;
                      auVar88._20_4_ = local_28e0._20_4_ * auVar46._20_4_;
                      auVar88._24_4_ = local_28e0._24_4_ * auVar46._24_4_;
                      auVar59 = auVar88._0_32_;
                      auVar88 = ZEXT3264(auVar59);
                      uVar30 = *(undefined4 *)(root.ptr + 0x30 + uVar24 * 4);
                      auVar36._4_4_ = uVar30;
                      auVar36._0_4_ = uVar30;
                      auVar36._8_4_ = uVar30;
                      auVar36._12_4_ = uVar30;
                      auVar36._16_4_ = uVar30;
                      auVar36._20_4_ = uVar30;
                      auVar36._24_4_ = uVar30;
                      auVar36._28_4_ = uVar30;
                      auVar46 = vsubps_avx(auVar36,auVar15);
                      auVar5._4_4_ = (float)local_2920._4_4_ * auVar46._4_4_;
                      auVar5._0_4_ = (float)local_2920._0_4_ * auVar46._0_4_;
                      auVar5._8_4_ = fStack_2918 * auVar46._8_4_;
                      auVar5._12_4_ = fStack_2914 * auVar46._12_4_;
                      auVar5._16_4_ = fStack_2910 * auVar46._16_4_;
                      auVar5._20_4_ = fStack_290c * auVar46._20_4_;
                      auVar5._24_4_ = fStack_2908 * auVar46._24_4_;
                      auVar5._28_4_ = (int)((ulong)local_29e0._24_8_ >> 0x20);
                      uVar30 = *(undefined4 *)(root.ptr + 0x50 + uVar24 * 4);
                      auVar37._4_4_ = uVar30;
                      auVar37._0_4_ = uVar30;
                      auVar37._8_4_ = uVar30;
                      auVar37._12_4_ = uVar30;
                      auVar37._16_4_ = uVar30;
                      auVar37._20_4_ = uVar30;
                      auVar37._24_4_ = uVar30;
                      auVar37._28_4_ = uVar30;
                      auVar46 = vsubps_avx(auVar37,auVar17);
                      auVar6._4_4_ = local_2900._4_4_ * auVar46._4_4_;
                      auVar6._0_4_ = local_2900._0_4_ * auVar46._0_4_;
                      auVar6._8_4_ = local_2900._8_4_ * auVar46._8_4_;
                      auVar6._12_4_ = local_2900._12_4_ * auVar46._12_4_;
                      auVar6._16_4_ = local_2900._16_4_ * auVar46._16_4_;
                      auVar6._20_4_ = local_2900._20_4_ * auVar46._20_4_;
                      auVar6._24_4_ = local_2900._24_4_ * auVar46._24_4_;
                      auVar6._28_4_ = (int)((ulong)local_29e0._56_8_ >> 0x20);
                      uVar30 = *(undefined4 *)(root.ptr + 0x70 + uVar24 * 4);
                      auVar38._4_4_ = uVar30;
                      auVar38._0_4_ = uVar30;
                      auVar38._8_4_ = uVar30;
                      auVar38._12_4_ = uVar30;
                      auVar38._16_4_ = uVar30;
                      auVar38._20_4_ = uVar30;
                      auVar38._24_4_ = uVar30;
                      auVar38._28_4_ = uVar30;
                      auVar46 = vsubps_avx(auVar38,auVar19);
                      auVar7._4_4_ = local_28e0._4_4_ * auVar46._4_4_;
                      auVar7._0_4_ = local_28e0._0_4_ * auVar46._0_4_;
                      auVar7._8_4_ = local_28e0._8_4_ * auVar46._8_4_;
                      auVar7._12_4_ = local_28e0._12_4_ * auVar46._12_4_;
                      auVar7._16_4_ = local_28e0._16_4_ * auVar46._16_4_;
                      auVar7._20_4_ = local_28e0._20_4_ * auVar46._20_4_;
                      auVar7._24_4_ = local_28e0._24_4_ * auVar46._24_4_;
                      auVar7._28_4_ = (int)((ulong)local_29e0._88_8_ >> 0x20);
                      auVar46 = vminps_avx(auVar57,auVar5);
                      auVar52 = vminps_avx(auVar83,auVar6);
                      auVar46 = vmaxps_avx(auVar46,auVar52);
                      auVar52 = vminps_avx(auVar59,auVar7);
                      auVar46 = vmaxps_avx(auVar46,auVar52);
                      auVar39._4_4_ = auVar91._4_4_ * auVar46._4_4_;
                      auVar39._0_4_ = auVar91._0_4_ * auVar46._0_4_;
                      auVar39._8_4_ = auVar91._8_4_ * auVar46._8_4_;
                      auVar39._12_4_ = auVar91._12_4_ * auVar46._12_4_;
                      auVar39._16_4_ = auVar91._16_4_ * auVar46._16_4_;
                      auVar39._20_4_ = auVar91._20_4_ * auVar46._20_4_;
                      auVar39._24_4_ = auVar91._24_4_ * auVar46._24_4_;
                      auVar39._28_4_ = auVar46._28_4_;
                      auVar46 = vmaxps_avx(auVar57,auVar5);
                      auVar52 = vmaxps_avx(auVar83,auVar6);
                      auVar52 = vminps_avx(auVar46,auVar52);
                      auVar46 = vmaxps_avx(auVar59,auVar7);
                      auVar46 = vminps_avx(auVar52,auVar46);
                      auVar8._4_4_ = fVar73 * auVar46._4_4_;
                      auVar8._0_4_ = fVar68 * auVar46._0_4_;
                      auVar8._8_4_ = fVar74 * auVar46._8_4_;
                      auVar8._12_4_ = fVar75 * auVar46._12_4_;
                      auVar8._16_4_ = fVar76 * auVar46._16_4_;
                      auVar8._20_4_ = fVar77 * auVar46._20_4_;
                      auVar8._24_4_ = fVar78 * auVar46._24_4_;
                      auVar8._28_4_ = auVar46._28_4_;
                      auVar46 = vmaxps_avx(auVar39,local_2860);
                      auVar52 = vminps_avx(auVar8,local_2840);
                    }
                    else {
                      uVar30 = *(undefined4 *)(uVar25 + 0x20 + uVar24 * 4);
                      auVar62._4_4_ = uVar30;
                      auVar62._0_4_ = uVar30;
                      auVar62._8_4_ = uVar30;
                      auVar62._12_4_ = uVar30;
                      auVar62._16_4_ = uVar30;
                      auVar62._20_4_ = uVar30;
                      auVar62._24_4_ = uVar30;
                      auVar62._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0x30 + uVar24 * 4);
                      auVar83._4_4_ = uVar30;
                      auVar83._0_4_ = uVar30;
                      auVar83._8_4_ = uVar30;
                      auVar83._12_4_ = uVar30;
                      auVar83._16_4_ = uVar30;
                      auVar83._20_4_ = uVar30;
                      auVar83._24_4_ = uVar30;
                      auVar83._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0x40 + uVar24 * 4);
                      auVar40._4_4_ = uVar30;
                      auVar40._0_4_ = uVar30;
                      auVar40._8_4_ = uVar30;
                      auVar40._12_4_ = uVar30;
                      auVar40._16_4_ = uVar30;
                      auVar40._20_4_ = uVar30;
                      auVar40._24_4_ = uVar30;
                      auVar40._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0x50 + uVar24 * 4);
                      auVar81._4_4_ = uVar30;
                      auVar81._0_4_ = uVar30;
                      auVar81._8_4_ = uVar30;
                      auVar81._12_4_ = uVar30;
                      auVar81._16_4_ = uVar30;
                      auVar81._20_4_ = uVar30;
                      auVar81._24_4_ = uVar30;
                      auVar81._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0x60 + uVar24 * 4);
                      auVar101._4_4_ = uVar30;
                      auVar101._0_4_ = uVar30;
                      auVar101._8_4_ = uVar30;
                      auVar101._12_4_ = uVar30;
                      auVar101._16_4_ = uVar30;
                      auVar101._20_4_ = uVar30;
                      auVar101._24_4_ = uVar30;
                      auVar101._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0x70 + uVar24 * 4);
                      auVar72._4_4_ = uVar30;
                      auVar72._0_4_ = uVar30;
                      auVar72._8_4_ = uVar30;
                      auVar72._12_4_ = uVar30;
                      auVar72._16_4_ = uVar30;
                      auVar72._20_4_ = uVar30;
                      auVar72._24_4_ = uVar30;
                      auVar72._28_4_ = uVar30;
                      fVar33 = *(float *)(uVar25 + 0x80 + uVar24 * 4);
                      auVar87._4_4_ = fVar33;
                      auVar87._0_4_ = fVar33;
                      auVar87._8_4_ = fVar33;
                      auVar87._12_4_ = fVar33;
                      auVar87._16_4_ = fVar33;
                      auVar87._20_4_ = fVar33;
                      auVar87._24_4_ = fVar33;
                      auVar87._28_4_ = fVar33;
                      fVar42 = *(float *)(uVar25 + 0x90 + uVar24 * 4);
                      auVar90._4_4_ = fVar42;
                      auVar90._0_4_ = fVar42;
                      auVar90._8_4_ = fVar42;
                      auVar90._12_4_ = fVar42;
                      auVar90._16_4_ = fVar42;
                      auVar90._20_4_ = fVar42;
                      auVar90._24_4_ = fVar42;
                      auVar90._28_4_ = fVar42;
                      fVar43 = *(float *)(uVar25 + 0xa0 + uVar24 * 4);
                      auVar94._4_4_ = fVar43;
                      auVar94._0_4_ = fVar43;
                      auVar94._8_4_ = fVar43;
                      auVar94._12_4_ = fVar43;
                      auVar94._16_4_ = fVar43;
                      auVar94._20_4_ = fVar43;
                      auVar94._24_4_ = fVar43;
                      auVar94._28_4_ = fVar43;
                      uVar30 = *(undefined4 *)(uVar25 + 0xb0 + uVar24 * 4);
                      auVar65._4_4_ = uVar30;
                      auVar65._0_4_ = uVar30;
                      auVar65._8_4_ = uVar30;
                      auVar65._12_4_ = uVar30;
                      auVar65._16_4_ = uVar30;
                      auVar65._20_4_ = uVar30;
                      auVar65._24_4_ = uVar30;
                      auVar65._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0xc0 + uVar24 * 4);
                      auVar53._4_4_ = uVar30;
                      auVar53._0_4_ = uVar30;
                      auVar53._8_4_ = uVar30;
                      auVar53._12_4_ = uVar30;
                      auVar53._16_4_ = uVar30;
                      auVar53._20_4_ = uVar30;
                      auVar53._24_4_ = uVar30;
                      auVar53._28_4_ = uVar30;
                      uVar30 = *(undefined4 *)(uVar25 + 0xd0 + uVar24 * 4);
                      auVar58._4_4_ = uVar30;
                      auVar58._0_4_ = uVar30;
                      auVar58._8_4_ = uVar30;
                      auVar58._12_4_ = uVar30;
                      auVar58._16_4_ = uVar30;
                      auVar58._20_4_ = uVar30;
                      auVar58._24_4_ = uVar30;
                      auVar58._28_4_ = uVar30;
                      auVar20._8_8_ = local_29e0._72_8_;
                      auVar20._0_8_ = local_29e0._64_8_;
                      auVar20._16_8_ = local_29e0._80_8_;
                      auVar20._24_8_ = local_29e0._88_8_;
                      auVar4 = vfmadd231ps_fma(auVar65,auVar20,auVar87);
                      auVar69 = vfmadd231ps_fma(auVar53,auVar20,auVar90);
                      auVar64 = vfmadd231ps_fma(auVar58,auVar20,auVar94);
                      auVar46._4_4_ = fVar33 * (float)local_2940._4_4_;
                      auVar46._0_4_ = fVar33 * (float)local_2940._0_4_;
                      auVar46._8_4_ = fVar33 * fStack_2938;
                      auVar46._12_4_ = fVar33 * fStack_2934;
                      auVar46._16_4_ = fVar33 * fStack_2930;
                      auVar46._20_4_ = fVar33 * fStack_292c;
                      auVar46._24_4_ = fVar33 * fStack_2928;
                      auVar46._28_4_ = fVar33;
                      auVar9._4_4_ = fVar42 * (float)local_2940._4_4_;
                      auVar9._0_4_ = fVar42 * (float)local_2940._0_4_;
                      auVar9._8_4_ = fVar42 * fStack_2938;
                      auVar9._12_4_ = fVar42 * fStack_2934;
                      auVar9._16_4_ = fVar42 * fStack_2930;
                      auVar9._20_4_ = fVar42 * fStack_292c;
                      auVar9._24_4_ = fVar42 * fStack_2928;
                      auVar9._28_4_ = fVar42;
                      auVar10._4_4_ = fVar43 * (float)local_2940._4_4_;
                      auVar10._0_4_ = fVar43 * (float)local_2940._0_4_;
                      auVar10._8_4_ = fVar43 * fStack_2938;
                      auVar10._12_4_ = fVar43 * fStack_2934;
                      auVar10._16_4_ = fVar43 * fStack_2930;
                      auVar10._20_4_ = fVar43 * fStack_292c;
                      auVar10._24_4_ = fVar43 * fStack_2928;
                      auVar10._28_4_ = fVar43;
                      auVar85 = vfmadd231ps_fma(auVar46,local_2960,auVar81);
                      auVar95 = vfmadd231ps_fma(auVar9,local_2960,auVar101);
                      auVar92 = vfmadd231ps_fma(auVar10,auVar72,local_2960);
                      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_2980,auVar62);
                      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_2980,auVar83);
                      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar40,local_2980);
                      auVar46 = vandps_avx(ZEXT1632(auVar85),local_27e0);
                      auVar47._8_4_ = 0x219392ef;
                      auVar47._0_8_ = 0x219392ef219392ef;
                      auVar47._12_4_ = 0x219392ef;
                      auVar47._16_4_ = 0x219392ef;
                      auVar47._20_4_ = 0x219392ef;
                      auVar47._24_4_ = 0x219392ef;
                      auVar47._28_4_ = 0x219392ef;
                      auVar46 = vcmpps_avx(auVar46,auVar47,1);
                      auVar52 = vblendvps_avx(ZEXT1632(auVar85),auVar47,auVar46);
                      auVar46 = vandps_avx(ZEXT1632(auVar95),local_27e0);
                      auVar46 = vcmpps_avx(auVar46,auVar47,1);
                      auVar59 = vblendvps_avx(ZEXT1632(auVar95),auVar47,auVar46);
                      auVar46 = vandps_avx(ZEXT1632(auVar92),local_27e0);
                      auVar100 = ZEXT3264(auVar100._0_32_);
                      auVar46 = vcmpps_avx(auVar46,auVar47,1);
                      auVar46 = vblendvps_avx(ZEXT1632(auVar92),auVar47,auVar46);
                      auVar18._8_8_ = local_29e0._40_8_;
                      auVar18._0_8_ = local_29e0._32_8_;
                      auVar18._16_8_ = local_29e0._48_8_;
                      auVar18._24_8_ = local_29e0._56_8_;
                      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar18,auVar81);
                      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar18,auVar101);
                      auVar63 = vrcpps_avx(auVar52);
                      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar18,auVar72);
                      auVar57 = vrcpps_avx(auVar59);
                      auVar41._8_4_ = 0x3f800000;
                      auVar41._0_8_ = &DAT_3f8000003f800000;
                      auVar41._12_4_ = 0x3f800000;
                      auVar41._16_4_ = 0x3f800000;
                      auVar41._20_4_ = 0x3f800000;
                      auVar41._24_4_ = 0x3f800000;
                      auVar41._28_4_ = 0x3f800000;
                      auVar4 = vfnmadd213ps_fma(auVar52,auVar63,auVar41);
                      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar63,auVar63);
                      auVar88 = ZEXT1664(auVar4);
                      auVar69 = vfnmadd213ps_fma(auVar59,auVar57,auVar41);
                      auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar57,auVar57);
                      auVar52 = vrcpps_avx(auVar46);
                      auVar64 = vfnmadd213ps_fma(auVar46,auVar52,auVar41);
                      auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar52,auVar52);
                      auVar16._8_8_ = local_29e0._8_8_;
                      auVar16._0_8_ = local_29e0._0_8_;
                      auVar16._16_8_ = local_29e0._16_8_;
                      auVar16._24_8_ = local_29e0._24_8_;
                      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar16,auVar62);
                      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar16,auVar83);
                      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar16,auVar40);
                      fVar45 = auVar85._0_4_ * -auVar4._0_4_;
                      fVar49 = auVar85._4_4_ * -auVar4._4_4_;
                      auVar11._4_4_ = fVar49;
                      auVar11._0_4_ = fVar45;
                      fVar50 = auVar85._8_4_ * -auVar4._8_4_;
                      auVar11._8_4_ = fVar50;
                      fVar51 = auVar85._12_4_ * -auVar4._12_4_;
                      auVar11._12_4_ = fVar51;
                      auVar11._16_4_ = 0x80000000;
                      auVar11._20_4_ = 0x80000000;
                      auVar11._24_4_ = 0x80000000;
                      auVar11._28_4_ = 0x80000000;
                      auVar54._0_4_ = auVar95._0_4_ * -auVar69._0_4_;
                      auVar54._4_4_ = auVar95._4_4_ * -auVar69._4_4_;
                      auVar54._8_4_ = auVar95._8_4_ * -auVar69._8_4_;
                      auVar54._12_4_ = auVar95._12_4_ * -auVar69._12_4_;
                      auVar54._16_4_ = 0x80000000;
                      auVar54._20_4_ = 0x80000000;
                      auVar54._24_4_ = 0x80000000;
                      auVar54._28_4_ = 0;
                      fVar33 = auVar92._0_4_ * -auVar64._0_4_;
                      fVar42 = auVar92._4_4_ * -auVar64._4_4_;
                      auVar12._4_4_ = fVar42;
                      auVar12._0_4_ = fVar33;
                      fVar43 = auVar92._8_4_ * -auVar64._8_4_;
                      auVar12._8_4_ = fVar43;
                      fVar44 = auVar92._12_4_ * -auVar64._12_4_;
                      auVar12._12_4_ = fVar44;
                      auVar12._16_4_ = 0x80000000;
                      auVar12._20_4_ = 0x80000000;
                      auVar12._24_4_ = 0x80000000;
                      auVar12._28_4_ = 0x80000000;
                      auVar59 = ZEXT1632(CONCAT412(auVar4._12_4_ + fVar51,
                                                   CONCAT48(auVar4._8_4_ + fVar50,
                                                            CONCAT44(auVar4._4_4_ + fVar49,
                                                                     auVar4._0_4_ + fVar45))));
                      auVar63 = ZEXT1632(CONCAT412(auVar69._12_4_ + auVar54._12_4_,
                                                   CONCAT48(auVar69._8_4_ + auVar54._8_4_,
                                                            CONCAT44(auVar69._4_4_ + auVar54._4_4_,
                                                                     auVar69._0_4_ + auVar54._0_4_))
                                                  ));
                      auVar99 = ZEXT3264(auVar99._0_32_);
                      auVar91 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                   CONCAT424(0x3f7ffffa,
                                                             CONCAT420(0x3f7ffffa,
                                                                       CONCAT416(0x3f7ffffa,
                                                                                 CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                      auVar96 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar57 = ZEXT1632(CONCAT412(auVar64._12_4_ + fVar44,
                                                   CONCAT48(auVar64._8_4_ + fVar43,
                                                            CONCAT44(auVar64._4_4_ + fVar42,
                                                                     auVar64._0_4_ + fVar33))));
                      auVar46 = vpminsd_avx2(auVar11,auVar59);
                      auVar52 = vpminsd_avx2(auVar54,auVar63);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar52);
                      auVar52 = vpminsd_avx2(auVar12,auVar57);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar52);
                      auVar52 = vpmaxsd_avx2(auVar11,auVar59);
                      auVar59 = vpmaxsd_avx2(auVar54,auVar63);
                      auVar59 = vpminsd_avx2(auVar52,auVar59);
                      auVar52 = vpmaxsd_avx2(auVar12,auVar57);
                      auVar59 = vpminsd_avx2(auVar59,auVar52);
                      auVar39._4_4_ = auVar46._4_4_ * 0.99999964;
                      auVar39._0_4_ = auVar46._0_4_ * 0.99999964;
                      auVar39._8_4_ = auVar46._8_4_ * 0.99999964;
                      auVar39._12_4_ = auVar46._12_4_ * 0.99999964;
                      auVar39._16_4_ = auVar46._16_4_ * 0.99999964;
                      auVar39._20_4_ = auVar46._20_4_ * 0.99999964;
                      auVar39._24_4_ = auVar46._24_4_ * 0.99999964;
                      auVar39._28_4_ = auVar52._28_4_;
                      auVar13._4_4_ = fVar73 * auVar59._4_4_;
                      auVar13._0_4_ = fVar68 * auVar59._0_4_;
                      auVar13._8_4_ = fVar74 * auVar59._8_4_;
                      auVar13._12_4_ = fVar75 * auVar59._12_4_;
                      auVar13._16_4_ = fVar76 * auVar59._16_4_;
                      auVar13._20_4_ = fVar77 * auVar59._20_4_;
                      auVar13._24_4_ = fVar78 * auVar59._24_4_;
                      auVar13._28_4_ = auVar59._28_4_;
                      auVar46 = vpmaxsd_avx2(auVar39,local_2860);
                      auVar52 = vpminsd_avx2(auVar13,local_2840);
                    }
                    auVar84 = ZEXT3264(auVar83);
                    auVar66 = ZEXT3264(auVar57);
                    auVar46 = vcmpps_avx(auVar46,auVar52,2);
                    auVar4 = vpackssdw_avx(auVar46._0_16_,auVar46._16_16_);
                    auVar46 = vpmovzxwd_avx2(auVar4);
                    auVar46 = vpslld_avx2(auVar46,0x1f);
                    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar46 >> 0x7f,0) != '\0') ||
                          (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar46 >> 0xbf,0) != '\0') ||
                        (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar46[0x1f] < '\0') {
                      auVar46 = vblendvps_avx(auVar96._0_32_,auVar39,auVar46);
                      if (uVar29 != 8) {
                        *puVar28 = uVar29;
                        puVar28 = puVar28 + 1;
                        *pauVar31 = auVar99._0_32_;
                        pauVar31 = pauVar31 + 1;
                      }
                      auVar99 = ZEXT3264(auVar46);
                      uVar29 = uVar2;
                    }
                  }
                  auVar46 = auVar99._0_32_;
                } while ((uVar2 != 8) && (bVar32 = uVar24 < 3, uVar24 = uVar24 + 1, bVar32));
                iVar22 = 0;
                if (uVar29 == 8) {
LAB_005bf309:
                  bVar32 = false;
                  iVar22 = 4;
                }
                else {
                  auVar52 = vcmpps_avx(local_2840,auVar46,6);
                  uVar30 = vmovmskps_avx(auVar52);
                  bVar32 = true;
                  if ((uint)POPCOUNT(uVar30) <= uVar23) {
                    *puVar28 = uVar29;
                    puVar28 = puVar28 + 1;
                    *pauVar31 = auVar46;
                    pauVar31 = pauVar31 + 1;
                    goto LAB_005bf309;
                  }
                }
                root.ptr = uVar29;
              } while (bVar32);
            }
          }
        }
      } while (iVar22 != 3);
      auVar46 = vandps_avx(local_2800,local_2a40);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar48._16_4_ = 0xff800000;
      auVar48._20_4_ = 0xff800000;
      auVar48._24_4_ = 0xff800000;
      auVar48._28_4_ = 0xff800000;
      auVar46 = vmaskmovps_avx(auVar46,auVar48);
      *(undefined1 (*) [32])(ray + 0x100) = auVar46;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }